

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

upb_MessageValue upb_MapIterator_Key(upb_Map *map,size_t iter)

{
  upb_strtable_iter *__src;
  size_t __n;
  upb_StringView uVar1;
  upb_MessageValue ret;
  upb_strtable_iter i;
  upb_MessageValue local_28;
  upb_strtable_iter local_18;
  
  local_18.t = (upb_strtable *)&map->t;
  if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
    local_18.index = iter;
    uVar1 = upb_strtable_iter_key(&local_18);
    __src = (upb_strtable_iter *)uVar1.data;
    __n = (size_t)map->key_size;
    if (__n == 0) {
      return (upb_MessageValue)uVar1;
    }
  }
  else {
    local_18.t = (upb_strtable *)upb_inttable_iter_key((upb_inttable *)local_18.t,iter);
    __src = &local_18;
    __n = (size_t)map->key_size;
  }
  memcpy(&local_28,__src,__n);
  return local_28;
}

Assistant:

upb_MessageValue upb_MapIterator_Key(const upb_Map* map, size_t iter) {
  upb_MessageValue ret;
  if (map->UPB_PRIVATE(is_strtable)) {
    upb_strtable_iter i;
    i.t = &map->t.strtable;
    i.index = iter;
    _upb_map_fromkey(upb_strtable_iter_key(&i), &ret, map->key_size);
  } else {
    uintptr_t intkey = upb_inttable_iter_key(&map->t.inttable, iter);
    memcpy(&ret, &intkey, map->key_size);
  }
  return ret;
}